

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O2

bool __thiscall cppnet::CppNetBase::ListenAndAccept(CppNetBase *this,string *ip,uint16_t port)

{
  bool ipv4;
  uint64_t sock;
  SingletonLogger *this_00;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  SysCallInt64Result SVar4;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    uVar1 = (long)(this->_dispatchers).
                  super__Vector_base<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_dispatchers).
                  super__Vector_base<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar1 <= uVar2) {
LAB_001086f8:
      return uVar1 <= uVar2;
    }
    ipv4 = Address::IsIpv4(ip);
    SVar4 = OsHandle::TcpSocket(ipv4);
    sock = SVar4._return_value;
    if ((long)sock < 0) {
      this_00 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Error
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/cppnet_base.cpp"
                 ,0x61,"create socket failed. err:%d",(ulong)(uint)SVar4._errno);
      goto LAB_001086f8;
    }
    ReusePort(sock);
    Dispatcher::Listen(*(Dispatcher **)
                        ((long)&(((this->_dispatchers).
                                  super__Vector_base<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + lVar3),sock,ip,port);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

bool CppNetBase::ListenAndAccept(const std::string& ip, uint16_t port) {
#ifdef __win__ // WEPOLL don't support reuse_port
    auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
    if (ret._return_value < 0) {
        LOG_ERROR("create socket failed. err:%d", ret._errno);
        return false;
    }
    for (size_t i = 0; i < _dispatchers.size(); i++) {
        _dispatchers[i]->Listen(ret._return_value, ip, port);
    }
#else
    if (__reuse_port) {
        for (size_t i = 0; i < _dispatchers.size(); i++) {
            auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
            if (ret._return_value < 0) {
                LOG_ERROR("create socket failed. err:%d", ret._errno);
                return false;
            }
            ReusePort(ret._return_value);
            _dispatchers[i]->Listen(ret._return_value, ip, port);
        }

    } else {
        auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. err:%d", ret._errno);
            return false;
        }
        for (size_t i = 0; i < _dispatchers.size(); i++) {
            _dispatchers[i]->Listen(ret._return_value, ip, port);
        }
    }
#endif
    return true;
}